

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool __thiscall LTACMasterdataChannel::InsertRequest(LTACMasterdataChannel *this,acStatUpdateTy *r)

{
  bool bVar1;
  _Rb_tree_const_iterator<acStatUpdateTy> this_00;
  long in_RDI;
  _Rb_tree_const_iterator<acStatUpdateTy> __first;
  pair<std::_Rb_tree_const_iterator<acStatUpdateTy>,_bool> pVar2;
  system_error *e;
  lock_guard<std::recursive_mutex> lock;
  set<acStatUpdateTy,_std::less<acStatUpdateTy>,_std::allocator<acStatUpdateTy>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  acStatUpdateTy *in_stack_ffffffffffffff58;
  _Rb_tree_const_iterator<acStatUpdateTy> in_stack_ffffffffffffff60;
  _Self local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Self local_38 [6];
  byte local_1;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (mutex_type *)in_stack_ffffffffffffff48);
  __first._M_node = (_Base_ptr)(in_RDI + 0x1e0);
  local_40 = (_Base_ptr)
             std::set<acStatUpdateTy,_std::less<acStatUpdateTy>,_std::allocator<acStatUpdateTy>_>::
             begin(in_stack_ffffffffffffff48);
  local_48 = (_Base_ptr)
             std::set<acStatUpdateTy,_std::less<acStatUpdateTy>,_std::allocator<acStatUpdateTy>_>::
             end(in_stack_ffffffffffffff48);
  this_00 = std::find<std::_Rb_tree_const_iterator<acStatUpdateTy>,acStatUpdateTy>
                      (__first,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_38[0]._M_node = this_00._M_node;
  local_50._M_node =
       (_Base_ptr)
       std::set<acStatUpdateTy,_std::less<acStatUpdateTy>,_std::allocator<acStatUpdateTy>_>::end
                 (in_stack_ffffffffffffff48);
  bVar1 = std::operator!=(local_38,&local_50);
  if (bVar1) {
    local_1 = 0;
    bVar1 = true;
  }
  else {
    pVar2 = std::set<acStatUpdateTy,_std::less<acStatUpdateTy>,_std::allocator<acStatUpdateTy>_>::
            insert((set<acStatUpdateTy,_std::less<acStatUpdateTy>,_std::allocator<acStatUpdateTy>_>
                    *)this_00._M_node,(value_type *)__first._M_node);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      bVar1 = false;
    }
    else {
      std::condition_variable::notify_all();
      local_1 = 1;
      bVar1 = true;
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c4602);
  if (!bVar1) {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LTACMasterdataChannel::InsertRequest (const acStatUpdateTy& r)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        
        // Avoid double entry: Bail if the same kind of request exists already
        // This is different from the duplication check that std::set::insert does
        // because it uses operator== (ignoring `distance`) instead operator<
        if (std::find(setAcStatRequ.begin(), setAcStatRequ.end(), r) != setAcStatRequ.end())
            return false;
        
        // Add the new request to the set and trigger the main loop if really inserted
        if (setAcStatRequ.insert(r).second) {
            FDThreadSynchCV.notify_all();
            return true;
        }
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
    return false;

}